

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cross_entropy_loss.cc
# Opt level: O0

void xLearn::ce_gradient_thread
               (DMatrix *matrix,Model *model,Score *score_func,bool is_norm,real_t *sum,
               size_t start_idx,size_t end_idx)

{
  value_type vVar1;
  value_type pvVar2;
  float fVar3;
  ostream *poVar4;
  const_reference ppvVar5;
  const_reference pvVar6;
  byte in_CL;
  long *in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  float *in_R8;
  ulong in_R9;
  float fVar7;
  double dVar8;
  ulong in_stack_00000008;
  real_t pg;
  real_t y;
  real_t pred;
  real_t norm;
  SparseRow *row;
  size_t i;
  Logger *in_stack_fffffffffffffec0;
  string *in_stack_ffffffffffffff28;
  undefined8 in_stack_ffffffffffffff30;
  int line;
  string *file;
  allocator *paVar9;
  LogSeverity severity;
  size_type local_a0;
  undefined1 local_91 [56];
  allocator local_59;
  string local_58 [36];
  Logger local_34;
  ulong local_30;
  float *local_28;
  byte local_19;
  long *local_18;
  undefined8 local_10;
  long local_8;
  
  line = (int)((ulong)in_stack_ffffffffffffff30 >> 0x20);
  local_19 = in_CL & 1;
  if (in_stack_00000008 < in_R9) {
    local_30 = in_R9;
    Logger::Logger(&local_34,ERR);
    paVar9 = &local_59;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_58,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/loss/cross_entropy_loss.cc"
               ,paVar9);
    severity = (LogSeverity)((ulong)paVar9 >> 0x20);
    file = (string *)local_91;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)(local_91 + 1),"ce_gradient_thread",(allocator *)file);
    poVar4 = Logger::Start(severity,file,line,in_stack_ffffffffffffff28);
    poVar4 = std::operator<<(poVar4,"CHECK_GE failed ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/loss/cross_entropy_loss.cc"
                            );
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x59);
    poVar4 = std::operator<<(poVar4,"\n");
    poVar4 = std::operator<<(poVar4,"end_idx");
    poVar4 = std::operator<<(poVar4," = ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,in_stack_00000008);
    poVar4 = std::operator<<(poVar4,"\n");
    poVar4 = std::operator<<(poVar4,"start_idx");
    poVar4 = std::operator<<(poVar4," = ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_30);
    std::operator<<(poVar4,"\n");
    std::__cxx11::string::~string((string *)(local_91 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_91);
    std::__cxx11::string::~string(local_58);
    std::allocator<char>::~allocator((allocator<char> *)&local_59);
    Logger::~Logger(in_stack_fffffffffffffec0);
    abort();
  }
  *in_R8 = 0.0;
  local_28 = in_R8;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  for (local_a0 = in_R9; local_a0 < in_stack_00000008; local_a0 = local_a0 + 1) {
    ppvVar5 = std::
              vector<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
              ::operator[]((vector<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
                            *)(local_8 + 0x18),local_a0);
    pvVar2 = *ppvVar5;
    if ((local_19 & 1) == 0) {
      vVar1 = 1.0;
    }
    else {
      pvVar6 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)(local_8 + 0x48),local_a0);
      vVar1 = *pvVar6;
    }
    fVar7 = (float)(**(code **)(*local_18 + 0x18))(vVar1,local_18,pvVar2,local_10);
    pvVar6 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)(local_8 + 0x30),local_a0);
    fVar3 = 1.0;
    if (*pvVar6 <= 0.0) {
      fVar3 = -1.0;
    }
    dVar8 = std::exp((double)(ulong)(uint)(-fVar3 * fVar7));
    dVar8 = std::log1p(dVar8);
    *local_28 = SUB84(dVar8,0) + *local_28;
    dVar8 = std::exp((double)(ulong)(uint)(-fVar3 * fVar7));
    (**(code **)(*local_18 + 0x20))
              (-fVar3 / (1.0 / SUB84(dVar8,0) + 1.0),vVar1,local_18,pvVar2,local_10);
  }
  return;
}

Assistant:

static void ce_gradient_thread(const DMatrix* matrix,
                               Model* model,
                               Score* score_func,
                               bool is_norm,
                               real_t* sum,
                               size_t start_idx,
                               size_t end_idx) {
  CHECK_GE(end_idx, start_idx);
  *sum = 0;
  for (size_t i = start_idx; i < end_idx; ++i) {
    SparseRow* row = matrix->row[i];
    real_t norm = is_norm ? matrix->norm[i] : 1.0;
    real_t pred = score_func->CalcScore(row, *model, norm);
    // partial gradient
    real_t y = matrix->Y[i] > 0 ? 1.0 : -1.0;
    *sum += log1p(exp(-y*pred));
    real_t pg = -y/(1.0+(1.0/exp(-y*pred)));
    // real gradient and update
    score_func->CalcGrad(row, *model, pg, norm);
  }
}